

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

Ptr __thiscall core::image::load_pfm_file(image *this,string *filename)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  FileException *this_00;
  int *piVar5;
  void *pvVar6;
  Exception *pEVar7;
  element_type *peVar8;
  undefined4 extraout_var;
  ImageBase *this_01;
  TypedImageBase<float> *pTVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar13;
  foreach_multiply_with_const<float> local_2b0;
  int local_2ac;
  long lStack_2a8;
  int y;
  char *ptr;
  size_t row_size;
  string local_290 [39];
  undefined1 local_269;
  float local_268;
  int iStack_264;
  char temp;
  float scale;
  int height;
  int width;
  int local_234;
  char local_22e;
  char local_22d;
  int channels;
  char signature [2];
  char local_220 [8];
  ifstream in;
  string *filename_local;
  Ptr *image;
  
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,pcVar4,_S_in);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    this_00 = (FileException *)__cxa_allocate_exception(0x48);
    piVar5 = __errno_location();
    pcVar4 = strerror(*piVar5);
    util::FileException::FileException(this_00,filename,pcVar4);
    __cxa_throw(this_00,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  std::istream::read(local_220,(long)&local_22e);
  local_234 = 0;
  if ((local_22e == 'P') && (local_22d == 'f')) {
    local_234 = 1;
  }
  else {
    if ((local_22e != 'P') || (local_22d != 'F')) {
      std::ifstream::close();
      height._2_1_ = 1;
      pEVar7 = (Exception *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&width,"PPM signature did not match",(allocator *)((long)&height + 3));
      util::Exception::Exception(pEVar7,(string *)&width);
      height._2_1_ = 0;
      __cxa_throw(pEVar7,&util::Exception::typeinfo,util::Exception::~Exception);
    }
    local_234 = 3;
  }
  scale = 0.0;
  iStack_264 = 0;
  local_268 = -1.0;
  pvVar6 = (void *)std::istream::operator>>(local_220,(int *)&scale);
  pvVar6 = (void *)std::istream::operator>>(pvVar6,&stack0xfffffffffffffd9c);
  std::istream::operator>>(pvVar6,&local_268);
  std::istream::read(local_220,(long)&local_269);
  if (0x10000000 < (int)scale * iStack_264) {
    std::ifstream::close();
    row_size._6_1_ = 1;
    pEVar7 = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_290,"Image too friggin huge",(allocator *)((long)&row_size + 7));
    util::Exception::Exception(pEVar7,(string *)local_290);
    row_size._6_1_ = 0;
    __cxa_throw(pEVar7,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  row_size._5_1_ = 0;
  Image<float>::create((Image<float> *)this,(int)scale,iStack_264,local_234);
  peVar8 = std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  iVar2 = (*(peVar8->super_TypedImageBase<float>).super_ImageBase._vptr_ImageBase[3])();
  this_01 = (ImageBase *)
            std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  iVar3 = ImageBase::height(this_01);
  ptr = (char *)(CONCAT44(extraout_var,iVar2) / (ulong)(long)iVar3);
  pTVar9 = &std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this)->super_TypedImageBase<float>;
  pfVar10 = TypedImageBase<float>::end(pTVar9);
  lStack_2a8 = (long)pfVar10 - (long)ptr;
  for (local_2ac = 0; local_2ac < iStack_264; local_2ac = local_2ac + 1) {
    std::istream::read(local_220,lStack_2a8);
    lStack_2a8 = lStack_2a8 - (long)ptr;
  }
  std::ifstream::close();
  if (0.0 <= local_268) {
    pTVar9 = &std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this)->super_TypedImageBase<float>;
    pfVar10 = TypedImageBase<float>::begin(pTVar9);
    pTVar9 = &std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this)->super_TypedImageBase<float>;
    pfVar11 = TypedImageBase<float>::end(pTVar9);
    pTVar9 = &std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this)->super_TypedImageBase<float>;
    pfVar12 = TypedImageBase<float>::begin(pTVar9);
    std::transform<float*,float*,float(*)(float_const&)>
              (pfVar10,pfVar11,pfVar12,util::system::betoh<float>);
  }
  else {
    pTVar9 = &std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this)->super_TypedImageBase<float>;
    pfVar10 = TypedImageBase<float>::begin(pTVar9);
    pTVar9 = &std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this)->super_TypedImageBase<float>;
    pfVar11 = TypedImageBase<float>::end(pTVar9);
    pTVar9 = &std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this)->super_TypedImageBase<float>;
    pfVar12 = TypedImageBase<float>::begin(pTVar9);
    std::transform<float*,float*,float(*)(float_const&)>
              (pfVar10,pfVar11,pfVar12,util::system::letoh<float>);
    local_268 = -local_268;
  }
  if ((local_268 != 1.0) || (NAN(local_268))) {
    pTVar9 = &std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this)->super_TypedImageBase<float>;
    pfVar10 = TypedImageBase<float>::begin(pTVar9);
    pTVar9 = &std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this)->super_TypedImageBase<float>;
    pfVar11 = TypedImageBase<float>::end(pTVar9);
    math::algo::foreach_multiply_with_const<float>::foreach_multiply_with_const
              (&local_2b0,&local_268);
    std::for_each<float*,math::algo::foreach_multiply_with_const<float>>(pfVar10,pfVar11,local_2b0);
  }
  row_size._5_1_ = 1;
  std::ifstream::~ifstream(local_220);
  PVar13.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar13.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar13.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

FloatImage::Ptr
load_pfm_file (std::string const& filename)
{
    std::ifstream in(filename.c_str());
    if (!in.good())
        throw util::FileException(filename, std::strerror(errno));

    char signature[2];
    in.read(signature, 2);

    // check signature and determine channels
    int channels = 0;
    if (signature[0] == 'P' && signature[1] == 'f')
        channels = 1;
    else if (signature[0] == 'P' && signature[1] == 'F')
        channels = 3;
    else
    {
        in.close();
        throw util::Exception("PPM signature did not match");
    }

    /* Read width and height as well as max value. */
    int width = 0;
    int height = 0;
    float scale = -1.0;
    in >> width >> height >> scale;

    /* Read final whitespace character. */
    char temp;
    in.read(&temp, 1);

    /* Check image width and height. Shouldn't be too large. */
    if (width * height > PPM_MAX_PIXEL_AMOUNT)
    {
        in.close();
        throw util::Exception("Image too friggin huge");
    }

    /* Read image rows in reverse order according to PFM specification. */
    FloatImage::Ptr image = FloatImage::create(width, height, channels);
    std::size_t row_size = image->get_byte_size() / image->height();
    char* ptr = reinterpret_cast<char*>(image->end()) - row_size;
    for (int y = 0; y < height; ++y, ptr -= row_size)
        in.read(ptr, row_size);
    in.close();

    /* Handle endianess. BE if scale > 0, LE if scale < 0. */
    if (scale < 0.0f)
    {
        std::transform(image->begin(), image->end(), image->begin(),
            (float(*)(float const&))util::system::letoh<float>);
        scale = -scale;
    }
    else
    {
        std::transform(image->begin(), image->end(), image->begin(),
            (float(*)(float const&))util::system::betoh<float>);
    }

    /* Handle scale. Multiply image values if scale is not 1.0. */
    if (scale != 1.0f)
    {
        std::for_each(image->begin(), image->end(),
            math::algo::foreach_multiply_with_const<float>(scale));
    }

   return image;
}